

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O0

void __thiscall wasm::extract(wasm *this,PassRunner *runner,Module *module,Name name)

{
  variant<wasm::Name,_wasm::HeapType> value;
  Name name_00;
  bool bVar1;
  PassRunner *pPVar2;
  size_t sVar3;
  bool bVar4;
  ostream *poVar5;
  pointer pFVar6;
  pointer pFVar7;
  char *pcVar8;
  Name name_01;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  allocator<char> local_351;
  string local_350;
  undefined1 local_330 [8];
  PassRunner postRunner;
  undefined8 uStack_238;
  undefined8 local_230;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_210 [3];
  Fatal local_1f8;
  Name local_70;
  reference local_60;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range1;
  bool found;
  Module *module_local;
  PassRunner *runner_local;
  Name name_local;
  
  pcVar8 = name.super_IString.str._M_len;
  runner_local = (PassRunner *)module;
  name_local.super_IString.str._M_len = (size_t)pcVar8;
  poVar5 = std::operator<<((ostream *)&std::cerr,"extracting ");
  name_01.super_IString.str._M_str = pcVar8;
  name_01.super_IString.str._M_len = name_local.super_IString.str._M_len;
  poVar5 = operator<<((wasm *)poVar5,(ostream *)runner_local,name_01);
  std::operator<<(poVar5,"\n");
  bVar1 = false;
  __end1 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    *)&runner->passes);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                *)&runner->passes);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                *)&func);
    if (!bVar4) break;
    local_60 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end1);
    pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (local_60);
    bVar4 = IString::operator!=((IString *)pFVar6,(IString *)&runner_local);
    if (bVar4) {
      Name::Name(&local_70,"env");
      pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_60);
      Name::operator=(&(pFVar6->super_Importable).module,&local_70);
      pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_60);
      pFVar7 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_60);
      Name::operator=(&(pFVar7->super_Importable).base,(Name *)pFVar6);
      pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_60);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::clear(&pFVar6->vars);
      pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_60);
      pFVar6->body = (Expression *)0x0;
    }
    else {
      bVar1 = true;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end1);
  }
  if (!bVar1) {
    Fatal::Fatal(&local_1f8);
    Fatal::operator<<(&local_1f8,(char (*) [40])"could not find the function to extract\n");
    Fatal::~Fatal(&local_1f8);
  }
  std::
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ::clear((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           *)runner);
  Module::updateMaps((Module *)runner);
  sVar3 = name_local.super_IString.str._M_len;
  pPVar2 = runner_local;
  std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name&,void,void,wasm::Name,void>
            ((variant<wasm::Name,wasm::HeapType> *)&postRunner.isNested,(Name *)&runner_local);
  name_00.super_IString.str._M_str = (char *)sVar3;
  name_00.super_IString.str._M_len = (size_t)pPVar2;
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_str = (char *)uStack_238;
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._0_1_ = postRunner.isNested;
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._1_1_ =
       postRunner.addedPassesRemovedDWARF;
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._2_6_ = postRunner._234_6_;
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_230;
  Builder::makeExport((Builder *)local_210,name_00,value,Function);
  Module::addExport((Module *)runner,local_210);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(local_210);
  PassRunner::PassRunner((PassRunner *)local_330,(PassRunner *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"remove-unused-module-elements",&local_351);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add((PassRunner *)local_330,&local_350,&local_380);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_380);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  PassRunner::run((PassRunner *)local_330);
  PassRunner::~PassRunner((PassRunner *)local_330);
  return;
}

Assistant:

static void extract(PassRunner* runner, Module* module, Name name) {
  std::cerr << "extracting " << name << "\n";
  bool found = false;
  for (auto& func : module->functions) {
    if (func->name != name) {
      // Turn it into an import.
      func->module = "env";
      func->base = func->name;
      func->vars.clear();
      func->body = nullptr;
    } else {
      found = true;
    }
  }
  if (!found) {
    Fatal() << "could not find the function to extract\n";
  }

  // Leave just one export, for the thing we want.
  module->exports.clear();
  module->updateMaps();
  module->addExport(Builder::makeExport(name, name, ExternalKind::Function));

  // Remove unneeded things.
  PassRunner postRunner(runner);
  postRunner.add("remove-unused-module-elements");
  postRunner.run();
}